

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

bool testing::internal::ParseNaturalNumber<int>(string *str,int *number)

{
  bool bVar1;
  const_reference pvVar2;
  int *piVar3;
  char *__nptr;
  ostream *poVar4;
  bool local_49;
  int result;
  GTestLog local_38;
  bool local_31;
  ulonglong uStack_30;
  bool parse_success;
  BiggestConvertible parsed;
  char *end;
  int *number_local;
  string *str_local;
  
  end = (char *)number;
  number_local = (int *)str;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (str);
  if (!bVar1) {
    pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        number_local,0);
    bVar1 = IsDigit(*pvVar2);
    if (bVar1) {
      piVar3 = __errno_location();
      *piVar3 = 0;
      __nptr = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     number_local);
      uStack_30 = strtoull(__nptr,(char **)&parsed,10);
      local_49 = false;
      if (*(char *)parsed == '\0') {
        piVar3 = __errno_location();
        local_49 = *piVar3 == 0;
      }
      local_31 = local_49;
      bVar1 = IsTrue(true);
      if (!bVar1) {
        GTestLog::GTestLog(&local_38,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/build_O0/_deps/googletest-src/googletest/src/gtest-internal-inl.h"
                           ,0x3ff);
        poVar4 = GTestLog::GetStream(&local_38);
        std::operator<<(poVar4,"Condition sizeof(Integer) <= sizeof(parsed) failed. ");
        GTestLog::~GTestLog(&local_38);
      }
      if (((local_31 & 1U) != 0) && ((long)(int)uStack_30 == uStack_30)) {
        *(int *)end = (int)uStack_30;
        return true;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool ParseNaturalNumber(const ::std::string& str, Integer* number) {
  // Fail fast if the given string does not begin with a digit;
  // this bypasses strtoXXX's "optional leading whitespace and plus
  // or minus sign" semantics, which are undesirable here.
  if (str.empty() || !IsDigit(str[0])) {
    return false;
  }
  errno = 0;

  char* end;
  // BiggestConvertible is the largest integer type that system-provided
  // string-to-number conversion routines can return.
  using BiggestConvertible = unsigned long long;  // NOLINT

  const BiggestConvertible parsed = strtoull(str.c_str(), &end, 10);  // NOLINT
  const bool parse_success = *end == '\0' && errno == 0;

  GTEST_CHECK_(sizeof(Integer) <= sizeof(parsed));

  const Integer result = static_cast<Integer>(parsed);
  if (parse_success && static_cast<BiggestConvertible>(result) == parsed) {
    *number = result;
    return true;
  }
  return false;
}